

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O0

AmsResponse * __thiscall
AmsConnection::Write(AmsConnection *this,AmsRequest *request,AmsAddr srcAddr)

{
  uint16_t __targetPort;
  uint16_t __cmdId;
  AmsAddr *__targetAddr;
  uint16_t __sourcePort;
  uint32_t uVar1;
  size_t sVar2;
  atomic<unsigned_int> *__n;
  size_t sVar3;
  void *__buf;
  AmsResponse *response;
  undefined1 local_60 [2];
  AmsTcpHeader header;
  AoEHeader aoeHeader;
  AmsRequest *request_local;
  AmsConnection *this_local;
  AmsAddr srcAddr_local;
  memory_order __b;
  
  __targetAddr = request->destAddr;
  __targetPort = request->destAddr->port;
  this_local._6_2_ = srcAddr.port;
  __sourcePort = this_local._6_2_;
  __cmdId = request->cmdId;
  this_local = (AmsConnection *)srcAddr;
  sVar2 = Frame::size(&request->frame);
  uVar1 = GetInvokeId(this);
  AoEHeader::AoEHeader
            ((AoEHeader *)local_60,&__targetAddr->netId,__targetPort,(AmsNetId *)&this_local,
             __sourcePort,__cmdId,(uint32_t)sVar2,uVar1);
  Frame::prepend<AoEHeader>(&request->frame,(AoEHeader *)local_60);
  sVar2 = Frame::size(&request->frame);
  AmsTcpHeader::AmsTcpHeader((AmsTcpHeader *)((long)&response + 2),(uint32_t)sVar2);
  Frame::prepend<AmsTcpHeader>(&request->frame,(AmsTcpHeader *)((long)&response + 2));
  srcAddr_local = (AmsAddr)Reserve(this,request,this_local._6_2_);
  if (srcAddr_local == (AmsAddr)0x0) {
    srcAddr_local.netId.b[0] = '\0';
    srcAddr_local.netId.b[1] = '\0';
    srcAddr_local.netId.b[2] = '\0';
    srcAddr_local.netId.b[3] = '\0';
    srcAddr_local.netId.b[4] = '\0';
    srcAddr_local.netId.b[5] = '\0';
    srcAddr_local.port = 0;
  }
  else {
    __n = (atomic<unsigned_int> *)((long)srcAddr_local + 8);
    uVar1 = AoEHeader::invokeId((AoEHeader *)local_60);
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    LOCK();
    (__n->super___atomic_base<unsigned_int>)._M_i = uVar1;
    UNLOCK();
    sVar2 = Frame::size(&request->frame);
    sVar3 = Socket::write(&(this->socket).super_Socket,(int)request,__buf,(size_t)__n);
    if (sVar2 != sVar3) {
      AmsResponse::Release((AmsResponse *)srcAddr_local);
      srcAddr_local.netId.b[0] = '\0';
      srcAddr_local.netId.b[1] = '\0';
      srcAddr_local.netId.b[2] = '\0';
      srcAddr_local.netId.b[3] = '\0';
      srcAddr_local.netId.b[4] = '\0';
      srcAddr_local.netId.b[5] = '\0';
      srcAddr_local.port = 0;
    }
  }
  return (AmsResponse *)srcAddr_local;
}

Assistant:

AmsResponse* AmsConnection::Write(AmsRequest& request, const AmsAddr srcAddr)
{
    const AoEHeader aoeHeader {
        request.destAddr.netId, request.destAddr.port,
        srcAddr.netId, srcAddr.port,
        request.cmdId,
        static_cast<uint32_t>(request.frame.size()),
        GetInvokeId()
    };
    request.frame.prepend<AoEHeader>(aoeHeader);

    const AmsTcpHeader header { static_cast<uint32_t>(request.frame.size()) };
    request.frame.prepend<AmsTcpHeader>(header);

    auto response = Reserve(&request, srcAddr.port);

    if (!response) {
        return nullptr;
    }

    response->invokeId.store(aoeHeader.invokeId());
    if (request.frame.size() != socket.write(request.frame)) {
        response->Release();
        return nullptr;
    }
    return response;
}